

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mul.h
# Opt level: O0

LinTerms * __thiscall
mp::
QCConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_0>
::LinearizeProductWithBinaryVar
          (QCConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_0>
           *this,double c,int x,int y)

{
  Arguments args;
  undefined1 uVar1;
  int iVar2;
  Var VVar3;
  undefined8 uVar4;
  LinTerms *this_00;
  undefined4 in_ECX;
  undefined4 in_EDX;
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_RSI;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_RDI;
  NodeRange NVar5;
  Var x_ifthen;
  int i_other;
  int i_bin;
  bool is_x_bin;
  LinTerms *lt;
  LinTerms *in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffeec;
  FlatModel<mp::DefaultFlatModelParams> *in_stack_fffffffffffffef0;
  undefined4 local_ec;
  undefined4 local_e8;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 uVar6;
  int in_stack_ffffffffffffff24;
  int iVar7;
  undefined6 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2e;
  CStringRef msg;
  undefined1 local_88 [56];
  Var local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined1 local_41;
  BasicCStringRef<char> local_40 [3];
  undefined1 local_21;
  undefined4 local_20;
  undefined4 local_1c;
  
  local_21 = 0;
  msg.data_ = (char *)in_RDI;
  local_20 = in_ECX;
  local_1c = in_EDX;
  LinTerms::LinTerms(in_stack_fffffffffffffee0);
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC(in_RSI);
  uVar1 = FlatModel<mp::DefaultFlatModelParams>::is_binary_var
                    (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  if (!(bool)uVar1) {
    BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::GetMC(in_RSI);
    in_stack_ffffffffffffff2e =
         FlatModel<mp::DefaultFlatModelParams>::is_binary_var
                   (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    if (!(bool)in_stack_ffffffffffffff2e) {
      uVar4 = __cxa_allocate_exception(0x18);
      uVar6 = (undefined4)uVar4;
      iVar7 = (int)((ulong)uVar4 >> 0x20);
      fmt::BasicCStringRef<char>::BasicCStringRef
                (local_40,"Can only convert product with a binary variable");
      Error::Error((Error *)CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff2e,
                                                    in_stack_ffffffffffffff28)),msg,iVar7);
      __cxa_throw(CONCAT44(iVar7,uVar6),&Error::typeinfo,Error::~Error);
    }
  }
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC(in_RSI);
  local_41 = FlatModel<mp::DefaultFlatModelParams>::is_binary_var
                       (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  uVar6 = CONCAT13(local_41,(int3)in_stack_ffffffffffffff1c);
  if ((bool)local_41) {
    local_e8 = local_1c;
  }
  else {
    local_e8 = local_20;
  }
  local_48 = local_e8;
  if ((bool)local_41) {
    local_ec = local_20;
  }
  else {
    local_ec = local_1c;
  }
  local_4c = local_ec;
  this_00 = (LinTerms *)
            BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
            ::GetMC(in_RSI);
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC(in_RSI);
  NVar5 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          ::MakeFixedVar((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                          *)msg.data_,
                         (double)CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff2e,
                                                         in_stack_ffffffffffffff28)));
  iVar2 = pre::NodeRange::operator_cast_to_int((NodeRange *)0x1db650);
  iVar7 = (int)((ulong)local_88 >> 0x20);
  args._M_elems[1] = in_stack_ffffffffffffff20;
  args._M_elems[0] = uVar6;
  args._M_elems[2] = in_stack_ffffffffffffff24;
  CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::IfThenId>
  ::CustomFunctionalConstraint
            ((CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::IfThenId>
              *)NVar5.ir_,args);
  VVar3 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
          ::
          AssignResultVar2Args<mp::CustomFunctionalConstraint<std::array<int,3ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::IfThenId>>
                    ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                      *)NVar5.pvn_,
                     (CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::IfThenId>
                      *)NVar5.ir_);
  CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::IfThenId>
  ::~CustomFunctionalConstraint
            ((CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::IfThenId>
              *)0x1db6b6);
  local_50 = VVar3;
  LinTerms::add_term(this_00,(double)CONCAT44(iVar2,VVar3),iVar7);
  return (LinTerms *)in_RDI;
}

Assistant:

LinTerms LinearizeProductWithBinaryVar(double c, int x, int y) {
    LinTerms lt;
    MP_ASSERT_ALWAYS(GetMC().is_binary_var(x) ||
                     GetMC().is_binary_var(y),
                     "Can only convert product with a binary variable");
    bool is_x_bin = GetMC().is_binary_var(x);
    auto i_bin = is_x_bin ? x : y;       // index of the (chosen) binary var
    auto i_other = is_x_bin ? y : x;                  // the other var index
    auto x_ifthen = GetMC().AssignResultVar2Args(
          IfThenConstraint {{      // no context as of now
                                   i_bin,
                                   i_other,
                                   int( GetMC().MakeFixedVar(0.0) )
                            }} );
    lt.add_term(c, x_ifthen);
    return lt;
  }